

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

uint32_t virtio_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  undefined8 *puVar1;
  size_t size;
  long lVar2;
  pkt_buf *ppVar3;
  short sVar4;
  FILE *__stream;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ssize_t sVar8;
  void *__s;
  uint *puVar9;
  mempool *pmVar10;
  long lVar11;
  ushort uVar12;
  undefined2 *puVar13;
  long lVar14;
  ixy_device *piVar15;
  int iVar16;
  ulong uVar17;
  dma_memory dVar18;
  ushort auStack_2b8 [256];
  ixy_device *piStack_b8;
  void *pvStack_b0;
  ulong uStack_a8;
  ushort uStack_94;
  ushort uStack_92;
  undefined2 *puStack_90;
  short sStack_82;
  ulong uStack_80;
  void *pvStack_78;
  undefined4 uStack_6c;
  ixy_device *piStack_68;
  uint *puStack_60;
  undefined2 local_2a;
  
  puVar9 = *(uint **)&ixy[1].num_rx_queues;
  while( true ) {
    if ((ushort)puVar9[10] == *(ushort *)(*(long *)(puVar9 + 6) + 2)) break;
    uVar17 = (ulong)*(uint *)(*(long *)(puVar9 + 6) + 4 +
                             ((ulong)(ushort)puVar9[10] % (ulong)*puVar9) * 8);
    lVar2 = *(long *)(puVar9 + 2);
    lVar11 = uVar17 * 0x10;
    *(undefined8 *)(lVar2 + lVar11) = 0;
    *(undefined4 *)(lVar2 + 8 + lVar11) = 0;
    pkt_buf_free(*(pkt_buf **)(puVar9 + uVar17 * 2 + 0xe));
    *(short *)(puVar9 + 10) = (short)puVar9[10] + 1;
  }
  if (num_bufs == 0) {
    uVar17 = 0;
  }
  else {
    uVar6 = *puVar9;
    uVar17 = 0;
    uVar12 = 0;
    do {
      uVar5 = (uint)uVar12;
      if (uVar12 < uVar6) {
        lVar2 = *(long *)(*(long *)(puVar9 + 2) + (ulong)uVar12 * 0x10);
        while (lVar2 != 0) {
          uVar12 = uVar12 + 1;
          uVar5 = (uint)uVar12;
          if (uVar6 <= uVar12) break;
          lVar2 = *(long *)(*(long *)(puVar9 + 2) + (ulong)uVar12 * 0x10);
        }
      }
      if (uVar6 == uVar5) goto code_r0x00106d8f;
      ppVar3 = bufs[uVar17];
      lVar11 = (ulong)uVar12 * 0x10;
      uVar6 = ppVar3->size;
      ixy[1].get_link_speed = ixy[1].get_link_speed + uVar6;
      ixy[1].read_stats = ixy[1].read_stats + 1;
      *(pkt_buf **)(puVar9 + (ulong)uVar12 * 2 + 0xe) = ppVar3;
      ppVar3->head_room[0x26] = '\0';
      ppVar3->head_room[0x27] = '\0';
      ppVar3->head_room[0x1e] = '\0';
      ppVar3->head_room[0x1f] = '\0';
      ppVar3->head_room[0x20] = '*';
      ppVar3->head_room[0x21] = '\0';
      ppVar3->head_room[0x22] = '\0';
      ppVar3->head_room[0x23] = '\0';
      ppVar3->head_room[0x24] = '\0';
      ppVar3->head_room[0x25] = '\0';
      lVar2 = *(long *)(puVar9 + 2);
      *(uint *)(lVar2 + 8 + lVar11) = uVar6 + 10;
      *(uintptr_t *)(lVar2 + lVar11) = ppVar3->buf_addr_phy + 0x36;
      *(undefined4 *)(lVar2 + 0xc + lVar11) = 0;
      uVar6 = *puVar9;
      iVar16 = (int)uVar17;
      uVar17 = uVar17 + 1;
      *(ushort *)
       (*(long *)(puVar9 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar9 + 4) + 2) + iVar16) % (ulong)uVar6) * 2) = uVar12
      ;
    } while (uVar17 != num_bufs);
    uVar17 = (ulong)num_bufs;
  }
code_r0x00106d8f:
  puVar13 = &local_2a;
  *(short *)(*(long *)(puVar9 + 4) + 2) = *(short *)(*(long *)(puVar9 + 4) + 2) + (short)uVar17;
  piVar15 = (ixy_device *)(ulong)*(uint *)&ixy[1].pci_addr;
  local_2a = 1;
  sVar8 = pwrite(*(uint *)&ixy[1].pci_addr,puVar13,2,0x10);
  uVar6 = (uint)puVar13;
  if (sVar8 == 2) {
    return (uint32_t)uVar17;
  }
  virtio_tx_batch_cold_1();
  sVar4 = (short)uVar6;
  piStack_68 = ixy;
  puStack_60 = puVar9;
  if ((ushort)(sVar4 - 3U) < 0xfffe) {
    piStack_b8 = (ixy_device *)0x1070ae;
    virtio_legacy_setup_tx_queue_cold_5();
    iVar16 = (int)piVar15;
LAB_001070ae:
    piStack_b8 = (ixy_device *)0x1070b3;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_001070b3:
    piStack_b8 = (ixy_device *)0x1070b8;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    iVar16 = *(int *)&piVar15[1].pci_addr;
    piStack_b8 = (ixy_device *)0x106e10;
    sStack_82 = sVar4;
    sVar8 = pwrite(iVar16,&sStack_82,2,0xe);
    ixy = piVar15;
    if (sVar8 != 2) goto LAB_001070ae;
    iVar16 = *(int *)&piVar15[1].pci_addr;
    piStack_b8 = (ixy_device *)0x106e31;
    sVar8 = pread(iVar16,&uStack_94,2,0xc);
    if (sVar8 != 2) goto LAB_001070b3;
    pvStack_b0 = (void *)CONCAT44(pvStack_b0._4_4_,(uint)uStack_94);
    piStack_b8 = (ixy_device *)0x106e75;
    uVar6 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar6 & 0xffff));
    uVar17 = (ulong)uVar6;
    uVar6 = (uint)uStack_94;
    if (uStack_94 == 0) goto LAB_00106e7a;
    uStack_80 = (ulong)((uint)uStack_94 * 8);
    size = (ulong)(((uint)uStack_94 + (uint)uStack_94 * 8) * 2 + 0x1003 & 0x3ff000) + 4 + uStack_80;
    piStack_b8 = (ixy_device *)0x106eb8;
    dVar18 = memory_allocate_dma(size,true);
    puStack_90 = (undefined2 *)dVar18.phy;
    __s = dVar18.virt;
    piStack_b8 = (ixy_device *)0x106ed0;
    memset(__s,0xab,size);
    piStack_b8 = (ixy_device *)0x106f01;
    pvStack_b0 = __s;
    pvStack_78 = __s;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    iVar16 = *(int *)&piVar15[1].pci_addr;
    uStack_6c = (undefined4)((ulong)puStack_90 >> 0xc);
    piStack_b8 = (ixy_device *)0x106f23;
    sVar8 = pwrite(iVar16,&uStack_6c,4,8);
    if (sVar8 == 4) {
      piStack_b8 = (ixy_device *)0x106f43;
      puVar9 = (uint *)calloc(1,uStack_80 + 0x38);
      *puVar9 = uVar6;
      __stream = _stderr;
      *(void **)(puVar9 + 2) = pvStack_78;
      pvStack_b0 = (void *)((ulong)uStack_94 * 0x10 + (long)pvStack_78);
      *(void **)(puVar9 + 4) = pvStack_b0;
      uStack_a8 = (long)pvStack_b0 + (ulong)uVar6 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar9 + 6) = uStack_a8;
      piStack_b8 = (ixy_device *)0x106fa1;
      fprintf(__stream,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar5 = *puVar9;
      puVar13 = *(undefined2 **)(puVar9 + 6);
      if ((ulong)uVar5 != 0) {
        lVar2 = *(long *)(puVar9 + 2);
        lVar11 = *(long *)(puVar9 + 4);
        lVar14 = 0;
        do {
          puVar1 = (undefined8 *)(lVar2 + lVar14 * 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined2 *)(lVar11 + 4 + lVar14) = 0;
          *(undefined8 *)(puVar13 + lVar14 * 2 + 2) = 0;
          lVar14 = lVar14 + 2;
        } while ((ulong)uVar5 * 2 != lVar14);
      }
      puVar13[1] = 0;
      puStack_90 = *(undefined2 **)(puVar9 + 4);
      puStack_90[1] = 0;
      *(undefined2 *)(puVar9 + 10) = 0;
      iVar16 = *(int *)&piVar15[1].pci_addr;
      piStack_b8 = (ixy_device *)0x107011;
      sVar8 = pread(iVar16,&uStack_92,2,0x10);
      if (sVar8 != 2) goto LAB_001070bd;
      piStack_b8 = (ixy_device *)0x10704b;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_92);
      *(ulong *)(puVar9 + 8) = (ulong)uStack_92;
      if (sVar4 == 2) {
        piStack_b8 = (ixy_device *)0x107064;
        pmVar10 = memory_allocate_mempool(uVar6,0x800);
        *(mempool **)(puVar9 + 0xc) = pmVar10;
        **(undefined2 **)(puVar9 + 4) = 1;
        **(undefined2 **)(puVar9 + 6) = 0;
LAB_0010709b:
        uVar17 = 0x88;
      }
      else {
        *puStack_90 = 1;
        uVar17 = 0x80;
        *puVar13 = 0;
        if (sVar4 != 1) goto LAB_0010709b;
      }
      *(uint **)((long)&piVar15->pci_addr + uVar17) = puVar9;
LAB_00106e7a:
      return (uint32_t)uVar17;
    }
  }
  piStack_b8 = (ixy_device *)0x1070bd;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_001070bd:
  piStack_b8 = (ixy_device *)0x1070c2;
  virtio_legacy_setup_tx_queue_cold_4();
  piStack_b8 = ixy;
  iVar7 = ioctl(iVar16,0x3b6c);
  if (iVar7 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_2b8[0] = 0;
    sVar8 = pread(iVar16,auStack_2b8,2,4);
    if (sVar8 == 2) {
      auStack_2b8[0] = auStack_2b8[0] | 4;
      sVar8 = pwrite(iVar16,auStack_2b8,2,4);
      if (sVar8 == 2) {
        return 2;
      }
      __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                    ,0x27,"void vfio_enable_dma(int)");
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

uint32_t virtio_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->tx_queue;

	_mm_mfence();
	// Free sent buffers
	while (vq->vq_used_last_idx != vq->vring.used->idx) {
		// info("We can free some buffers: %u != %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("e %p, id %u", e, e->id);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		desc->addr = 0;
		desc->len = 0;
		pkt_buf_free(vq->virtual_addresses[e->id]);
		vq->vq_used_last_idx++;
		_mm_mfence();
	}
	// Send buffers
	uint32_t buf_idx;
	uint16_t idx = 0; // Keep index of last found free descriptor and start searching from there
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		struct pkt_buf* buf = bufs[buf_idx];
		// Find free desc index
		for (; idx < vq->vring.num; ++idx) {
			struct vring_desc* desc = &vq->vring.desc[idx];
			if (desc->addr == 0) {
				break;
			}
		}
		if (idx == vq->vring.num) {
			break;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);

		// Update tx counter
		dev->tx_bytes += buf->size;
		dev->tx_pkts++;

		vq->virtual_addresses[idx] = buf;

		// Copy header to headroom in front of data buffer
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));

		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = 0;
		vq->vring.desc[idx].next = 0;
		vq->vring.avail->ring[(vq->vring.avail->idx + buf_idx) % vq->vring.num] = idx;
	}
	_mm_mfence();
	vq->vring.avail->idx += buf_idx;
	_mm_mfence();
	virtio_legacy_notify_queue(dev, 1);
	return buf_idx;
}